

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAndroidExtensionPackES31ATests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImplementationLimitCase::iterate
          (ImplementationLimitCase *this)

{
  int *value;
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  GLenum err;
  undefined4 extraout_var;
  char *pcVar4;
  MessageBuilder *pMVar5;
  StateQueryMemoryWriteGuard<int> result;
  CallLogWrapper gl;
  undefined1 local_198 [384];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&result);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Querying ");
  pcVar4 = glu::getGettableStateName(this->m_target);
  std::operator<<((ostream *)poVar1,pcVar4);
  std::operator<<((ostream *)poVar1,", expecting at least ");
  value = &this->m_minValue;
  pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,value);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,this->m_target,&result.m_value);
  err = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(err,"implementation limit query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAndroidExtensionPackES31ATests.cpp"
                  ,0x68);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((bVar2) && (result.m_value < *value)) {
    local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// ERROR: Got ");
    std::ostream::operator<<(poVar1,result.m_value);
    std::operator<<((ostream *)poVar1,", expected at least ");
    pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,value);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Too low implementation limit");
  }
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

ImplementationLimitCase::IterateResult ImplementationLimitCase::iterate (void)
{
	using namespace gls::StateQueryUtil;

	glu::CallLogWrapper						gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	StateQueryMemoryWriteGuard<glw::GLint>	result;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Querying " << glu::getGettableStateName(m_target) << ", expecting at least " << m_limit
		<< tcu::TestLog::EndMessage;

	gl.enableLogging(true);
	gl.glGetIntegerv(m_target, &result);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "implementation limit query failed");

	if (result.verifyValidity(m_testCtx) && result < m_limit)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "// ERROR: Got " << result << ", expected at least " << m_limit
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Too low implementation limit");
	}

	return STOP;
}